

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O0

bool __thiscall QRegularExpressionMatch::hasCaptured(QRegularExpressionMatch *this,int nth)

{
  int iVar1;
  const_reference plVar2;
  int in_ESI;
  QList<long_long> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  
  if ((-1 < in_ESI) &&
     (iVar1 = lastCapturedIndex((QRegularExpressionMatch *)0x730184), in_ESI <= iVar1)) {
    QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>::operator->
              ((QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate> *)0x73019f);
    plVar2 = QList<long_long>::at(in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
    return *plVar2 != -1;
  }
  return false;
}

Assistant:

bool QRegularExpressionMatch::hasCaptured(int nth) const
{
    if (nth < 0 || nth > lastCapturedIndex())
        return false;

    return d->capturedOffsets.at(nth * 2) != -1;
}